

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdlib.cpp
# Opt level: O0

void ScanDirectory(TArray<FFileList,_FFileList> *list,char *dirpath)

{
  uint uVar1;
  DIR *__dirp;
  dirent *pdVar2;
  FFileList *this;
  FString *this_00;
  char *pcVar3;
  FString local_c8;
  FString newdir;
  stat fileStat;
  FFileList *fl;
  dirent *file;
  DIR *directory;
  char *dirpath_local;
  TArray<FFileList,_FFileList> *list_local;
  
  __dirp = opendir(dirpath);
  if (__dirp != (DIR *)0x0) {
    while (pdVar2 = readdir(__dirp), pdVar2 != (dirent *)0x0) {
      if (pdVar2->d_name[0] != '.') {
        uVar1 = TArray<FFileList,_FFileList>::Reserve(list,1);
        this = TArray<FFileList,_FFileList>::operator[](list,(ulong)uVar1);
        this_00 = FString::operator<<(&this->Filename,dirpath);
        FString::operator<<(this_00,pdVar2->d_name);
        pcVar3 = FString::operator_cast_to_char_(&this->Filename);
        stat(pcVar3,(stat *)&newdir);
        this->isDirectory = ((uint)fileStat.st_nlink & 0xf000) == 0x4000;
        if ((this->isDirectory & 1U) != 0) {
          FString::FString(&local_c8,&this->Filename);
          FString::operator+=(&local_c8,"/");
          pcVar3 = FString::operator_cast_to_char_(&local_c8);
          ScanDirectory(list,pcVar3);
          FString::~FString(&local_c8);
        }
      }
    }
    closedir(__dirp);
  }
  return;
}

Assistant:

void ScanDirectory(TArray<FFileList> &list, const char *dirpath)
{
	DIR *directory = opendir(dirpath);
	if(directory == NULL)
		return;

	struct dirent *file;
	while((file = readdir(directory)) != NULL)
	{
		if(file->d_name[0] == '.') //File is hidden or ./.. directory so ignore it.
			continue;

		FFileList *fl = &list[list.Reserve(1)];
		fl->Filename << dirpath << file->d_name;

		struct stat fileStat;
		stat(fl->Filename, &fileStat);
		fl->isDirectory = S_ISDIR(fileStat.st_mode);

		if(fl->isDirectory)
		{
			FString newdir = fl->Filename;
			newdir += "/";
			ScanDirectory(list, newdir);
			continue;
		}
	}

	closedir(directory);
}